

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_util.c
# Opt level: O0

int SampleUtil_Initialize(print_string print_function)

{
  pthread_mutexattr_t local_14;
  print_string p_Stack_10;
  ithread_mutexattr_t attr;
  print_string print_function_local;
  
  if (initialize_init != 0) {
    p_Stack_10 = print_function;
    pthread_mutexattr_init(&local_14);
    pthread_mutexattr_settype(&local_14,1);
    pthread_mutex_init((pthread_mutex_t *)&display_mutex,&local_14);
    pthread_mutexattr_destroy(&local_14);
    pthread_mutex_lock((pthread_mutex_t *)&display_mutex);
    gPrintFun = p_Stack_10;
    pthread_mutex_unlock((pthread_mutex_t *)&display_mutex);
    initialize_init = 0;
  }
  return 0;
}

Assistant:

int SampleUtil_Initialize(print_string print_function)
{
	if (initialize_init) {
		ithread_mutexattr_t attr;

		ithread_mutexattr_init(&attr);
		ithread_mutexattr_setkind_np(&attr, ITHREAD_MUTEX_RECURSIVE_NP);
		ithread_mutex_init(&display_mutex, &attr);
		ithread_mutexattr_destroy(&attr);
		/* To shut up valgrind mutex warning. */
		ithread_mutex_lock(&display_mutex);
		gPrintFun = print_function;
		ithread_mutex_unlock(&display_mutex);
		/* Finished initializing. */
		initialize_init = 0;
	}

	return UPNP_E_SUCCESS;
}